

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCloseCursor(BtCursor *pCur)

{
  int *piVar1;
  Btree *p;
  BtShared *pBVar2;
  BtCursor *pBVar3;
  MemPage *pPage;
  int in_EAX;
  int extraout_EAX;
  int extraout_EAX_00;
  BtCursor *pBVar4;
  BtCursor **ppBVar5;
  
  p = pCur->pBtree;
  if (p != (Btree *)0x0) {
    pBVar2 = pCur->pBt;
    if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
      btreeLockCarefully(p);
    }
    pBVar4 = pBVar2->pCursor;
    if (pBVar2->pCursor == pCur) {
      ppBVar5 = &pBVar2->pCursor;
LAB_001547ff:
      *ppBVar5 = pCur->pNext;
    }
    else {
      do {
        pBVar3 = pBVar4->pNext;
        if (pBVar3 == pCur) {
          ppBVar5 = &pBVar4->pNext;
          goto LAB_001547ff;
        }
        pBVar4 = pBVar3;
      } while (pBVar3 != (BtCursor *)0x0);
    }
    btreeReleaseAllCursorPages(pCur);
    if ((pBVar2->inTransaction == '\0') && (pPage = pBVar2->pPage1, pPage != (MemPage *)0x0)) {
      pBVar2->pPage1 = (MemPage *)0x0;
      releasePageOne(pPage);
    }
    sqlite3_free(pCur->aOverflow);
    sqlite3_free(pCur->pKey);
    in_EAX = extraout_EAX;
    if (p->sharable != '\0') {
      piVar1 = &p->wantToLock;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        unlockBtreeMutex(p);
        in_EAX = extraout_EAX_00;
      }
    }
    pCur->pBtree = (Btree *)0x0;
  }
  return in_EAX;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCloseCursor(BtCursor *pCur){
  Btree *pBtree = pCur->pBtree;
  if( pBtree ){
    BtShared *pBt = pCur->pBt;
    sqlite3BtreeEnter(pBtree);
    assert( pBt->pCursor!=0 );
    if( pBt->pCursor==pCur ){
      pBt->pCursor = pCur->pNext;
    }else{
      BtCursor *pPrev = pBt->pCursor;
      do{
        if( pPrev->pNext==pCur ){
          pPrev->pNext = pCur->pNext;
          break;
        }
        pPrev = pPrev->pNext;
      }while( ALWAYS(pPrev) );
    }
    btreeReleaseAllCursorPages(pCur);
    unlockBtreeIfUnused(pBt);
    sqlite3_free(pCur->aOverflow);
    sqlite3_free(pCur->pKey);
    sqlite3BtreeLeave(pBtree);
    pCur->pBtree = 0;
  }
  return SQLITE_OK;
}